

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone_test.c
# Opt level: O1

int main(void)

{
  putchar(10);
  clone_test(3);
  clone_test(4);
  clone_test(2);
  putchar(10);
  return 0;
}

Assistant:

int
main (void)
{
	puts("");

	clone_test (SRC_ZERO_ORDER_HOLD) ;
	clone_test (SRC_LINEAR) ;
#ifdef ENABLE_SINC_FAST_CONVERTER
	clone_test (SRC_SINC_FASTEST) ;
#endif
	puts("");

	return 0 ;
}